

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

double __thiscall soplex::SLUFactor<double>::matrixMetric(SLUFactor<double> *this,int type)

{
  double dVar1;
  int iVar2;
  const_reference pvVar3;
  int in_ESI;
  long *in_RDI;
  Real RVar4;
  int i_2;
  int i_1;
  double absdiag;
  int i;
  double maxdiag;
  double mindiag;
  double result;
  int local_48;
  int local_44;
  int local_34;
  double local_30;
  double local_28;
  double local_20;
  double local_8;
  
  local_20 = 0.0;
  iVar2 = (**(code **)(*in_RDI + 0x20))();
  if (iVar2 == 0) {
    local_8 = 1.0;
  }
  else {
    if (in_ESI == 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),0);
      local_28 = spxAbs<double>(*pvVar3);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),0);
      local_30 = spxAbs<double>(*pvVar3);
      for (local_34 = 1; iVar2 = (**(code **)(*in_RDI + 0x20))(), local_34 < iVar2;
          local_34 = local_34 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),
                            (long)local_34);
        RVar4 = spxAbs<double>(*pvVar3);
        dVar1 = RVar4;
        if ((local_28 <= RVar4) && (dVar1 = local_28, local_30 < RVar4)) {
          local_30 = RVar4;
        }
        local_28 = dVar1;
      }
      local_20 = local_30 / local_28;
    }
    else if (in_ESI == 1) {
      local_20 = 0.0;
      for (local_44 = 0; iVar2 = (**(code **)(*in_RDI + 0x20))(), local_44 < iVar2;
          local_44 = local_44 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),
                            (long)local_44);
        local_20 = 1.0 / *pvVar3 + local_20;
      }
    }
    else if (in_ESI == 2) {
      local_20 = 1.0;
      for (local_48 = 0; iVar2 = (**(code **)(*in_RDI + 0x20))(), local_48 < iVar2;
          local_48 = local_48 + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1e),
                            (long)local_48);
        local_20 = *pvVar3 * local_20;
      }
      local_20 = 1.0 / local_20;
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

R SLUFactor<R>::matrixMetric(int type) const
{
   R result = 0.0;

   // catch corner case of empty matrix
   if(dim() == 0)
      return 1.0;

   switch(type)
   {
   // compute condition estimate by ratio of max/min of elements on the diagonal
   case 0:
   {
      R mindiag = spxAbs(this->diag[0]);
      R maxdiag = spxAbs(this->diag[0]);

      for(int i = 1; i < dim(); ++i)
      {
         R absdiag = spxAbs(this->diag[i]);

         if(absdiag < mindiag)
            mindiag = absdiag;
         else if(absdiag > maxdiag)
            maxdiag = absdiag;
      }

      result = maxdiag / mindiag;
      break;
   }

   // compute sum of inverses of all elements on the diagonal
   case 1:
      result = 0.0;

      for(int i = 0; i < dim(); ++i)
         result += 1.0 / this->diag[i];

      break;

   // compute determinant (product of all diagonal elements of U)
   case 2:
      result = 1.0;

      for(int i = 0; i < dim(); ++i)
         result *= this->diag[i];

      result = 1.0 / result;
      break;
   }

   return result;
}